

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onemax.cpp
# Opt level: O2

float computeProbability(void)

{
  uint uVar1;
  result_type_conflict1 rVar2;
  random_device rd;
  mt19937 engine;
  param_type local_2720;
  random_device local_2718;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1390;
  
  std::random_device::random_device(&local_2718);
  local_2720._M_a = 0.0;
  local_2720._M_b = 100.0;
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1390,(ulong)uVar1);
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&local_2720,&local_1390);
  std::random_device::~random_device(&local_2718);
  return rVar2;
}

Assistant:

float computeProbability()
{
    std::random_device rd;
    std::uniform_real_distribution<float> distribution(0.0, 100.0);
    std::mt19937 engine(rd()); // Mersenne twister MT19937

    return distribution(engine);
}